

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::write_pe_vc_cryptofield
          (bt_peer_connection *this,span<char> write_buf,int crypto_field,int pad_size)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  span<char> buffer;
  
  pcVar3 = write_buf.m_ptr;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  bVar1 = 0x18;
  lVar2 = 0;
  do {
    pcVar3[lVar2 + 8] = (char)((uint)crypto_field >> (bVar1 & 0x1f));
    lVar2 = lVar2 + 1;
    bVar1 = bVar1 - 8;
  } while (lVar2 != 4);
  bVar1 = 8;
  lVar2 = 0;
  do {
    pcVar3[lVar2 + 0xc] = (char)((pad_size & 0xffffU) >> (bVar1 & 0x1f));
    lVar2 = lVar2 + 1;
    bVar1 = bVar1 - 8;
  } while (lVar2 != 2);
  buffer.m_len = 2;
  buffer.m_ptr = (char *)(long)pad_size;
  random_bytes((aux *)(pcVar3 + 0xe),buffer);
  if (((this->super_peer_connection).field_0x885 & 8) != 0) {
    bVar1 = 8;
    lVar2 = 0;
    do {
      (pcVar3 + pad_size)[lVar2 + 0xe] = (char)(0x44 >> (bVar1 & 0x1f));
      lVar2 = lVar2 + 1;
      bVar1 = bVar1 - 8;
    } while (lVar2 != 2);
  }
  return;
}

Assistant:

void bt_peer_connection::write_pe_vc_cryptofield(
		span<char> write_buf
		, int const crypto_field
		, int const pad_size)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(crypto_field <= 0x03 && crypto_field > 0);
		// vc,crypto_field,len(pad),pad, (len(ia))
		TORRENT_ASSERT((write_buf.size() >= 8+4+2+pad_size+2
				&& is_outgoing())
			|| (write_buf.size() >= 8+4+2+pad_size && !is_outgoing()));
		TORRENT_ASSERT(!m_sent_handshake);

		// encrypt(vc, crypto_provide/select, len(Pad), len(IA))
		// len(pad) is zero for now, len(IA) only for outgoing connections

		// vc
		std::memset(write_buf.data(), 0, 8);
		write_buf = write_buf.subspan(8);

		aux::write_uint32(crypto_field, write_buf);
		aux::write_uint16(pad_size, write_buf); // len (pad)

		aux::random_bytes(write_buf.first(pad_size));
		write_buf = write_buf.subspan(pad_size);

		// append len(ia) if we are initiating
		if (is_outgoing())
			aux::write_uint16(handshake_len, write_buf); // len(IA)
	}